

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Store::Collect(Store *this)

{
  uint uVar1;
  ulong *puVar2;
  Object *pOVar3;
  Ref *pRVar4;
  ulong uVar5;
  pointer pRVar6;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar7;
  pointer pRVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong __new_size;
  ulong *puVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  allocator_type local_7a;
  bool local_79;
  pointer local_78;
  pointer local_70;
  FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
  *local_68;
  vector<bool,_std::allocator<bool>_> *local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_70 = (this->objects_).list_.
             super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (this->objects_).list_.
             super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  __new_size = (long)local_78 - (long)local_70 >> 3;
  local_60 = &this->marks_;
  std::vector<bool,_std::allocator<bool>_>::resize(local_60,__new_size,false);
  puVar12 = (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar2 = (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_finish.super__Bit_iterator_base._M_offset;
  if (puVar12 != puVar2) {
    memset(puVar12,0,(long)puVar2 - (long)puVar12);
    puVar12 = puVar2;
  }
  if (uVar1 != 0) {
    *puVar12 = *puVar12 & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  pRVar6 = (this->roots_).list_.
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar8 = (this->roots_).list_.
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar8 != pRVar6) {
    uVar11 = 0;
    do {
      uVar10 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar10 = uVar11;
      }
      if (((this->roots_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar10 >> 6) +
            (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar11 & 0x3f) & 1) == 0) {
        pRVar4 = FreeList<wabt::interp::Ref>::Get(&this->roots_,uVar11);
        uVar10 = pRVar4->index;
        uVar5 = uVar10 + 0x3f;
        if (-1 < (long)uVar10) {
          uVar5 = uVar10;
        }
        puVar12 = (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                  ((long)uVar5 >> 6) +
                  (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
        *puVar12 = *puVar12 | 1L << ((byte)uVar10 & 0x3f);
        pRVar6 = (this->roots_).list_.
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pRVar8 = (this->roots_).list_.
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)pRVar8 - (long)pRVar6 >> 3));
  }
  local_68 = &this->objects_;
  local_79 = false;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58,__new_size,&local_79,&local_7a);
  if (local_78 != local_70) {
    uVar11 = 0;
    bVar14 = false;
    do {
      while( true ) {
        uVar10 = uVar11 + 0x3f;
        if (-1 < (long)uVar11) {
          uVar10 = uVar11;
        }
        lVar9 = (long)uVar10 >> 6;
        uVar5 = (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001);
        uVar10 = 1L << ((byte)uVar11 & 0x3f);
        if (((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[lVar9 + (uVar5 - 1)] >> (uVar11 & 0x3f) & 1) !=
             0) || (((local_60->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [lVar9 + uVar5 + 0xffffffffffffffff] & uVar10) == 0)) break;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[lVar9 + (uVar5 - 1)] =
             local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[lVar9 + (uVar5 - 1)] | uVar10;
        puVar7 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
                 ::Get(local_68,uVar11);
        pOVar3 = (puVar7->_M_t).
                 super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                 .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
        (*pOVar3->_vptr_Object[2])(pOVar3,this);
        bVar14 = uVar11 + 1 < __new_size;
        uVar11 = uVar11 + 1;
        if (!bVar14) {
          uVar11 = 0;
        }
      }
      bVar13 = uVar11 + 1 < __new_size;
      uVar11 = uVar11 + 1;
      if (!bVar13) {
        uVar11 = 0;
      }
      bVar15 = bVar13 || bVar14;
      bVar14 = (bool)(bVar14 & bVar13);
    } while (bVar15);
  }
  if (local_78 != local_70) {
    uVar11 = 0;
    do {
      if (uVar11 < (ulong)((long)(this->objects_).list_.
                                 super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->objects_).list_.
                                 super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        uVar10 = uVar11 + 0x3f;
        if (-1 < (long)uVar11) {
          uVar10 = uVar11;
        }
        uVar5 = (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001);
        if ((((this->objects_).is_free_.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
              [((long)uVar10 >> 6) + uVar5 + 0xffffffffffffffff] >> (uVar11 & 0x3f) & 1) == 0) &&
           ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[((long)uVar10 >> 6) + (uVar5 - 1)] &
            1L << ((byte)uVar11 & 0x3f)) == 0)) {
          FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
          ::Delete(local_68,uVar11);
        }
      }
      uVar11 = uVar11 + 1;
    } while (__new_size + (__new_size == 0) != uVar11);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Store::Collect() {
  size_t object_count = objects_.size();
  marks_.resize(object_count);
  std::fill(marks_.begin(), marks_.end(), false);

  // First mark all roots.
  for (RootList::Index i = 0; i < roots_.size(); ++i) {
    if (roots_.IsUsed(i)) {
      Mark(roots_.Get(i));
    }
  }

  // TODO: better GC algo.
  // Loop through all newly marked objects and mark their referents.
  std::vector<bool> all_marked(object_count, false);
  bool new_marked;
  do {
    new_marked = false;
    for (size_t i = 0; i < object_count; ++i) {
      if (!all_marked[i] && marks_[i]) {
        all_marked[i] = true;
        objects_.Get(i)->Mark(*this);
        new_marked = true;
      }
    }
  } while (new_marked);

  // Delete all unmarked objects.
  for (size_t i = 0; i < object_count; ++i) {
    if (objects_.IsUsed(i) && !all_marked[i]) {
      objects_.Delete(i);
    }
  }
}